

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# space_mixer.c
# Opt level: O0

void calculate_pitch_shift(space_source *source,space_mixer_data *listener)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float local_5c;
  float local_58;
  float pitch;
  float SS_DF;
  float vss;
  float vls;
  float Mag;
  float DF;
  float SS;
  float *LV;
  float *SV;
  float local_20;
  float SL [3];
  space_mixer_data *listener_local;
  space_source *source_local;
  
  if (0.0 < listener->doppler_factor) {
    SV._4_4_ = listener->location[0] - source->location[0];
    local_20 = listener->location[1] - source->location[1];
    SL[0] = listener->location[2] - source->location[2];
    fVar5 = listener->soundspeed;
    fVar1 = listener->doppler_factor;
    SL._4_8_ = listener;
    fVar2 = vec_length((float *)((long)&SV + 4));
    fVar3 = vec_dot((float *)((long)&SV + 4),listener->velocity);
    fVar4 = vec_dot((float *)((long)&SV + 4),source->velocity);
    local_5c = fVar5 / fVar1;
    local_58 = local_5c;
    if (fVar4 * fVar2 < local_5c) {
      local_58 = fVar4 * fVar2;
    }
    if (fVar3 * fVar2 < local_5c) {
      local_5c = fVar3 * fVar2;
    }
    if (0.5 <= (-fVar1 * local_5c + fVar5) / (-fVar1 * local_58 + fVar5)) {
      if (2.0 <= (-fVar1 * local_5c + fVar5) / (-fVar1 * local_58 + fVar5)) {
        fVar5 = 2.0;
      }
      else {
        fVar5 = (-fVar1 * local_5c + fVar5) / (-fVar1 * local_58 + fVar5);
      }
    }
    else {
      fVar5 = 0.5;
    }
    source->pitch = fVar5;
  }
  else {
    source->pitch = 1.0;
  }
  return;
}

Assistant:

VECTORIZE static void calculate_pitch_shift(struct space_source *source, struct space_mixer_data *listener){
  if(listener->doppler_factor <= 0.0){
    source->pitch = 1.0;
    return;
  }
  // See OpenAL1.1 specification §3.5.2
  float SL[3] = {listener->location[0] - source->location[0],
                 listener->location[1] - source->location[1],
                 listener->location[2] - source->location[2]};
  float *SV = source->velocity;
  float *LV = listener->velocity;
  float SS = listener->soundspeed;
  float DF = listener->doppler_factor;
  float Mag = vec_length(SL);
  float vls = vec_dot(SL, LV) * Mag;
  float vss = vec_dot(SL, SV) * Mag;
  float SS_DF = SS/DF;
  vss = MIN(vss, SS_DF);
  vls = MIN(vls, SS_DF);
  float pitch = CLAMP(0.5, (SS - DF*vls) / (SS - DF*vss), 2.0);
  source->pitch = pitch;
}